

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_warning.c
# Opt level: O0

void TIFFWarningExtR(TIFF *tif,char *module,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  thandle_t local_108;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_3c;
  undefined1 local_38 [4];
  int stop;
  va_list ap;
  char *fmt_local;
  char *module_local;
  TIFF *tif_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  ap[0].reg_save_area = fmt;
  if ((tif != (TIFF *)0x0) && (tif->tif_warnhandler != (TIFFErrorHandlerExtR)0x0)) {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    stop = 0x30;
    local_38 = (undefined1  [4])0x18;
    iVar1 = (*tif->tif_warnhandler)
                      (tif,tif->tif_warnhandler_user_data,module,fmt,(__va_list_tag *)local_38);
    if (iVar1 != 0) {
      return;
    }
    local_3c = 0;
  }
  if (_TIFFwarningHandler != (TIFFErrorHandler)0x0) {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    stop = 0x30;
    local_38 = (undefined1  [4])0x18;
    (*_TIFFwarningHandler)(module,(char *)ap[0].reg_save_area,(__va_list_tag *)local_38);
  }
  if (_TIFFwarningHandlerExt != (TIFFErrorHandlerExt)0x0) {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    stop = 0x30;
    local_38 = (undefined1  [4])0x18;
    if (tif == (TIFF *)0x0) {
      local_108 = (thandle_t)0x0;
    }
    else {
      local_108 = tif->tif_clientdata;
    }
    (*_TIFFwarningHandlerExt)
              (local_108,module,(char *)ap[0].reg_save_area,(__va_list_tag *)local_38);
  }
  return;
}

Assistant:

void TIFFWarningExtR(TIFF *tif, const char *module, const char *fmt, ...)
{
    va_list ap;
    if (tif && tif->tif_warnhandler)
    {
        va_start(ap, fmt);
        int stop = (*tif->tif_warnhandler)(tif, tif->tif_warnhandler_user_data,
                                           module, fmt, ap);
        va_end(ap);
        if (stop)
            return;
    }
    if (_TIFFwarningHandler)
    {
        va_start(ap, fmt);
        (*_TIFFwarningHandler)(module, fmt, ap);
        va_end(ap);
    }
    if (_TIFFwarningHandlerExt)
    {
        va_start(ap, fmt);
        (*_TIFFwarningHandlerExt)(tif ? tif->tif_clientdata : 0, module, fmt,
                                  ap);
        va_end(ap);
    }
}